

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::AddProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,bool throwIfNotExtensible,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  int iVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  code *pcVar4;
  uint uVar5;
  ScriptContext *scriptContext;
  bool bVar6;
  bool bVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  undefined6 extraout_var;
  BigDictionaryTypeHandler *this_00;
  Var pvVar10;
  DictionaryPropertyDescriptor<unsigned_short> *local_80;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  JavascriptLibrary *local_70;
  uint local_64;
  ScriptContext *local_60;
  PropertyValueInfo *local_58;
  Var local_50;
  uint local_44;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<unsigned_short> newDescriptor;
  
  local_58 = info;
  local_50 = value;
  local_40 = propertyRecord;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x862,"(instance)","instance");
    if (!bVar6) goto LAB_00c2ebfe;
    *puVar9 = 0;
  }
  local_60 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  local_44 = propertyRecord->pid;
  bVar6 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_40,&local_80);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x868,
                                "(!propertyMap->TryGetReference(propertyRecord, &descriptor))",
                                "!propertyMap->TryGetReference(propertyRecord, &descriptor)");
    if (!bVar6) goto LAB_00c2ebfe;
    *puVar9 = 0;
  }
  if (local_40->isNumeric == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x869,"(!propertyRecord->IsNumeric())",
                                "!propertyRecord->IsNumeric()");
    if (!bVar6) goto LAB_00c2ebfe;
    *puVar9 = 0;
  }
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar6 = DynamicTypeHandler::VerifyIsExtensible
                        (&this->super_DynamicTypeHandler,local_60,throwIfNotExtensible), !bVar6)) {
    return 0;
  }
  iVar2 = (this->super_DynamicTypeHandler).slotCapacity;
  if (iVar2 <= (int)(uint)this->nextPropertyIndex) {
    if ((0xfffd < iVar2) || (DAT_0145c360 <= iVar2)) {
      this_00 = ConvertToBigDictionaryTypeHandler(this,instance);
      BVar8 = DictionaryTypeHandlerBase<int>::AddProperty
                        (this_00,instance,local_40,local_50,attributes,local_58,flags,false,
                         possibleSideEffects);
      return BVar8;
    }
    EnsureSlotCapacity(this,instance,1);
  }
  propertyRecord_local._2_2_ = ::Math::PostInc<unsigned_short>(&this->nextPropertyIndex);
  local_64 = (uint)CONCAT62(extraout_var,propertyRecord_local._2_2_);
  propertyRecord_local._0_1_ = 1;
  propertyRecord_local._4_4_ = 0xffffffff;
  propertyRecord_local._1_1_ = attributes;
  if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x884,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar6) goto LAB_00c2ebfe;
    *puVar9 = 0;
  }
  pvVar10 = local_50;
  pRVar3 = (this->singletonInstance).ptr;
  if (pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef == instance) {
      if (((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
         (propertyRecord_local._0_1_ = 9,
         (flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
         PropertyOperation_None && 0xf < local_44)) {
        if (local_50 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x88f,"(value != nullptr)","value != nullptr");
          if (!bVar6) goto LAB_00c2ebfe;
          *puVar9 = 0;
        }
        BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar8 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x891,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar6) goto LAB_00c2ebfe;
          *puVar9 = 0;
        }
        bVar6 = VarIs<Js::JavascriptFunction>(pvVar10);
        if (bVar6) {
          bVar7 = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          bVar6 = DynamicTypeHandler::ShouldFixDataProperties();
          bVar7 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_40,pvVar10);
          bVar7 = bVar7 && bVar6;
        }
        propertyRecord_local._0_1_ = bVar7 << 5 | 9;
      }
      goto LAB_00c2eaa4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x887,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar6) {
LAB_00c2ebfe:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  if ((flags & PropertyOperation_PreInit) == PropertyOperation_None) {
    propertyRecord_local._0_1_ = 9;
  }
LAB_00c2eaa4:
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_40,
             (DictionaryPropertyDescriptor<unsigned_short> *)&propertyRecord_local);
  if ((attributes & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  scriptContext = local_60;
  local_70 = (local_60->super_ScriptContextBase).javascriptLibrary;
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)&descriptor
             ,&local_70->typesWithOnlyWritablePropertyProtoChain);
  uVar5 = local_44;
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
            ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)descriptor,
             &this->super_DynamicTypeHandler,attributes,local_44,scriptContext);
  bVar6 = NoSpecialPropertyCache::IsSpecialProperty(uVar5);
  pvVar10 = local_50;
  if ((bVar6) &&
     (bVar6 = DynamicTypeHandler::GetHasSpecialProperties(&this->super_DynamicTypeHandler), !bVar6))
  {
    bVar6 = NoSpecialPropertyCache::IsDefaultSpecialProperty(instance,local_70,uVar5);
    if (bVar6) {
      if (local_58 != (PropertyValueInfo *)0x0) {
        local_58->m_instance = &instance->super_RecyclableObject;
        local_58->m_propertyIndex = 0xffff;
        local_58->m_attributes = '\0';
        local_58->flags = InlineCacheNoFlags;
      }
    }
    else {
      pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes;
      *pTVar1 = *pTVar1 | 0x80;
      if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
        Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
        WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                        &descriptor,&local_70->typesWithNoSpecialPropertyProtoChain);
        pvVar10 = local_50;
        PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                  ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)descriptor);
      }
    }
  }
  uVar5 = local_64;
  DynamicTypeHandler::SetSlotUnchecked(instance,local_64 & 0xffff,pvVar10);
  if (local_58 != (PropertyValueInfo *)0x0) {
    if (((byte)propertyRecord_local & 0x20) != 0) {
      attributes = '\0';
    }
    local_58->m_instance = &instance->super_RecyclableObject;
    local_58->m_propertyIndex = -(ushort)(((byte)propertyRecord_local & 0x20) != 0) | (ushort)uVar5;
    local_58->m_attributes = attributes;
    local_58->flags = InlineCacheNoFlags;
  }
  ScriptContext::InvalidateProtoCaches(local_60,local_40->pid);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,local_40->pid,pvVar10,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::AddProperty(DynamicObject* instance, const PropertyRecord* propertyRecord, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, bool throwIfNotExtensible, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        PropertyId propertyId = propertyRecord->GetPropertyId();
#if DBG
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(!propertyMap->TryGetReference(propertyRecord, &descriptor));
        Assert(!propertyRecord->IsNumeric());
#endif

        if (!isForce)
        {
            if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
            {
                return FALSE;
            }
        }

        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize ||
                (this->GetSlotCapacity() >= CONFIG_FLAG(BigDictionaryTypeHandlerThreshold) && !this->IsBigDictionaryTypeHandler()))
            {
                BigDictionaryTypeHandler* newTypeHandler = ConvertToBigDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyRecord, value, attributes, info, flags, false, possibleSideEffects);
            }
            this->EnsureSlotCapacity(instance);
        }

        T index = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(index, attributes);

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

        if ((flags & PropertyOperation_PreInit) == 0)
        {
            newDescriptor.SetIsInitialized(true);
            if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
            {
                Assert(value != nullptr);
                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                Assert(!instance->IsExternal());
                newDescriptor.SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() & CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }
        JavascriptLibrary* library = scriptContext->GetLibrary();

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        if (NoSpecialPropertyCache::IsSpecialProperty(propertyId) && !this->GetHasSpecialProperties())
        {
            if (!NoSpecialPropertyCache::IsDefaultSpecialProperty(instance, library, propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        SetSlotUnchecked(instance, index, value);

#if ENABLE_FIXED_FIELDS
        // If we just added a fixed method, don't populate the inline cache so that we always take the
        // slow path when overwriting this property and correctly invalidate any JIT-ed code that hard-coded
        // this method.
        if (newDescriptor.GetIsFixed())
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }
        else
#endif
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }

        // Always invalidate prototype caches when we add a property.  Previously, we only did this if the current
        // type is used as a prototype, or if the new property is also found on the prototype chain (because
        // adding a new field doesn't create a new dictionary type).  However, if the new property is already in
        // the cache as a missing property, we have to invalidate the prototype caches.
        scriptContext->InvalidateProtoCaches(propertyRecord->GetPropertyId());

        SetPropertyUpdateSideEffect(instance, propertyRecord->GetPropertyId(), value, possibleSideEffects);
        return true;
    }